

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run_command.cpp
# Opt level: O3

UniValue *
RunCommandParseJSON(UniValue *__return_storage_ptr__,string *str_command,string *str_std_in)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  FILE *__s;
  void *pvVar4;
  char cVar5;
  pair<int,_int> pVar6;
  ssize_t sVar7;
  runtime_error *prVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  long in_FS_OFFSET;
  int n_error;
  string error;
  string result;
  Popen c;
  istringstream stderr_stream;
  istringstream stdout_stream;
  UniValue result_json;
  undefined1 local_52c [4];
  undefined1 local_528 [32];
  pointer local_508;
  pointer local_500;
  pointer local_4f8;
  string local_4e8;
  pair<int,_int> local_4c8;
  undefined8 local_4c0;
  undefined1 local_4b8;
  undefined7 uStack_4b7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a8;
  Popen local_488;
  undefined1 *local_3b0;
  undefined8 local_3a8;
  undefined1 local_3a0;
  undefined8 local_39f;
  undefined4 local_397;
  undefined2 local_393;
  char local_391;
  long local_390 [2];
  string local_380 [104];
  ios_base local_318 [264];
  long local_210 [2];
  string local_200 [104];
  ios_base local_198 [264];
  UniValue local_90;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  paVar2 = &local_90.val.field_2;
  local_90.val._M_string_length = 0;
  local_90.val.field_2._M_local_buf[0] = '\0';
  local_90.typ = VNULL;
  local_90.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_90.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_90.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_90.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_90.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_90.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_90.val._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::istringstream::istringstream((istringstream *)local_210);
  std::__cxx11::istringstream::istringstream((istringstream *)local_390);
  if (str_command->_M_string_length == 0) {
    local_3b0 = &local_3a0;
    __return_storage_ptr__->typ = VNULL;
    (__return_storage_ptr__->val)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->val).field_2
    ;
    (__return_storage_ptr__->val).field_2._M_local_buf[0] = '\0';
    *(undefined8 *)((long)&(__return_storage_ptr__->val).field_2 + 1) = local_39f;
    *(undefined4 *)((long)&(__return_storage_ptr__->val).field_2 + 9) = local_397;
    *(undefined2 *)((long)&(__return_storage_ptr__->val).field_2 + 0xd) = local_393;
    (__return_storage_ptr__->val).field_2._M_local_buf[0xf] = local_391;
    (__return_storage_ptr__->val)._M_string_length = 0;
    local_3a8 = 0;
    local_3a0 = 0;
    (__return_storage_ptr__->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl
    .super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl
    .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->keys).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl
    .super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->keys).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->keys).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  }
  else {
    local_4a8._M_dataplus._M_p = (pointer)0xffffffffffffffff;
    local_4a8._M_dataplus._M_p = (pointer)subprocess::util::pipe_cloexec();
    local_4c8.first = -1;
    local_4c8.second = -1;
    local_4c8 = subprocess::util::pipe_cloexec();
    local_528._0_4_ = local_528._0_4_ & 0xffffff00;
    local_528._4_4_ = -1;
    local_528._8_4_ = -1;
    pVar6 = subprocess::util::pipe_cloexec();
    local_528._4_4_ = pVar6.first;
    local_528._8_4_ = pVar6.second;
    subprocess::Popen::Popen<subprocess::input,subprocess::output,subprocess::error>
              (&local_488,str_command,(input *)&local_4a8,(output *)&local_4c8,(error *)local_528);
    if ((str_std_in->_M_string_length != 0) &&
       (__s = (FILE *)((local_488.stream_.comm_.stream_)->input_).
                      super___shared_ptr<_IO_FILE,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
       __s != (FILE *)0x0)) {
      fwrite((str_std_in->_M_dataplus)._M_p,1,str_std_in->_M_string_length,__s);
    }
    subprocess::Popen::communicate
              ((pair<subprocess::Buffer,_subprocess::Buffer> *)local_528,&local_488,(char *)0x0,0);
    paVar3 = &local_4a8.field_2;
    local_4a8._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::
    _M_construct<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
              ((string *)&local_4a8,CONCAT44(local_528._4_4_,local_528._0_4_),
               CONCAT44(local_528._12_4_,local_528._8_4_));
    std::__cxx11::stringbuf::str(local_200);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4a8._M_dataplus._M_p != paVar3) {
      operator_delete(local_4a8._M_dataplus._M_p,
                      CONCAT71(local_4a8.field_2._M_allocated_capacity._1_7_,
                               local_4a8.field_2._M_local_buf[0]) + 1);
    }
    local_4a8._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::
    _M_construct<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
              ((string *)&local_4a8,local_508,local_500);
    std::__cxx11::stringbuf::str(local_380);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4a8._M_dataplus._M_p != paVar3) {
      operator_delete(local_4a8._M_dataplus._M_p,
                      CONCAT71(local_4a8.field_2._M_allocated_capacity._1_7_,
                               local_4a8.field_2._M_local_buf[0]) + 1);
    }
    local_4a8._M_string_length = 0;
    local_4a8.field_2._M_local_buf[0] = '\0';
    pVar6 = (pair<int,_int>)&local_4b8;
    local_4c0 = 0;
    local_4b8 = 0;
    local_4c8 = pVar6;
    local_4a8._M_dataplus._M_p = (pointer)paVar3;
    cVar5 = std::ios::widen((char)(istringstream *)local_210 +
                            (char)*(undefined8 *)(local_210[0] + -0x18));
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)local_210,(string *)&local_4a8,cVar5);
    cVar5 = std::ios::widen((char)(istringstream *)local_390 +
                            (char)*(undefined8 *)(local_390[0] + -0x18));
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)local_390,(string *)&local_4c8,cVar5);
    local_52c = (undefined1  [4])local_488.retcode_;
    if (local_488.retcode_ != 0) {
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
      tinyformat::format<std::__cxx11::string,int,std::__cxx11::string>
                (&local_4e8,(tinyformat *)"RunCommandParseJSON error: process(%s) returned %d: %s\n"
                 ,(char *)str_command,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_52c,
                 &local_4c8.first,in_R9);
      std::runtime_error::runtime_error(prVar8,(string *)&local_4e8);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      goto LAB_007285e2;
    }
    sVar7 = UniValue::read(&local_90,(int)local_4a8._M_string_length,local_4a8._M_dataplus._M_p,
                           (size_t)pVar6);
    if ((char)sVar7 == '\0') {
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::operator+(&local_4e8,"Unable to parse JSON: ",&local_4a8);
      std::runtime_error::runtime_error(prVar8,(string *)&local_4e8);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      goto LAB_007285e2;
    }
    __return_storage_ptr__->typ = local_90.typ;
    paVar1 = &(__return_storage_ptr__->val).field_2;
    (__return_storage_ptr__->val)._M_dataplus._M_p = (pointer)paVar1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90.val._M_dataplus._M_p == paVar2) {
      paVar1->_M_allocated_capacity =
           CONCAT71(local_90.val.field_2._M_allocated_capacity._1_7_,
                    local_90.val.field_2._M_local_buf[0]);
      *(undefined8 *)((long)&(__return_storage_ptr__->val).field_2 + 8) = local_90.val.field_2._8_8_
      ;
    }
    else {
      (__return_storage_ptr__->val)._M_dataplus._M_p = local_90.val._M_dataplus._M_p;
      (__return_storage_ptr__->val).field_2._M_allocated_capacity =
           CONCAT71(local_90.val.field_2._M_allocated_capacity._1_7_,
                    local_90.val.field_2._M_local_buf[0]);
    }
    (__return_storage_ptr__->val)._M_string_length = local_90.val._M_string_length;
    local_90.val._M_string_length = 0;
    local_90.val.field_2._M_local_buf[0] = '\0';
    (__return_storage_ptr__->keys).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         local_90.keys.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    (__return_storage_ptr__->keys).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_90.keys.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    (__return_storage_ptr__->keys).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_90.keys.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_90.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_90.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_90.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl
    .super__Vector_impl_data._M_start =
         local_90.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
         super__Vector_impl_data._M_start;
    (__return_storage_ptr__->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl
    .super__Vector_impl_data._M_finish =
         local_90.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
         super__Vector_impl_data._M_finish;
    (__return_storage_ptr__->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl
    .super__Vector_impl_data._M_end_of_storage =
         local_90.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_90.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_90.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_90.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_90.val._M_dataplus._M_p = (pointer)paVar2;
    if (local_4c8 != (pair<int,_int>)&local_4b8) {
      operator_delete((void *)local_4c8,CONCAT71(uStack_4b7,local_4b8) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4a8._M_dataplus._M_p != paVar3) {
      operator_delete(local_4a8._M_dataplus._M_p,
                      CONCAT71(local_4a8.field_2._M_allocated_capacity._1_7_,
                               local_4a8.field_2._M_local_buf[0]) + 1);
    }
    if (local_508 != (pointer)0x0) {
      operator_delete(local_508,(long)local_4f8 - (long)local_508);
    }
    pvVar4 = (void *)CONCAT44(local_528._4_4_,local_528._0_4_);
    if (pvVar4 != (void *)0x0) {
      operator_delete(pvVar4,local_528._16_8_ - (long)pvVar4);
    }
    subprocess::Popen::~Popen(&local_488);
  }
  std::__cxx11::istringstream::~istringstream((istringstream *)local_390);
  std::ios_base::~ios_base(local_318);
  std::__cxx11::istringstream::~istringstream((istringstream *)local_210);
  std::ios_base::~ios_base(local_198);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_90.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_90.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.val._M_dataplus._M_p != paVar2) {
    operator_delete(local_90.val._M_dataplus._M_p,
                    CONCAT71(local_90.val.field_2._M_allocated_capacity._1_7_,
                             local_90.val.field_2._M_local_buf[0]) + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
LAB_007285e2:
  __stack_chk_fail();
}

Assistant:

UniValue RunCommandParseJSON(const std::string& str_command, const std::string& str_std_in)
{
#ifdef ENABLE_EXTERNAL_SIGNER
    namespace sp = subprocess;

    UniValue result_json;
    std::istringstream stdout_stream;
    std::istringstream stderr_stream;

    if (str_command.empty()) return UniValue::VNULL;

    auto c = sp::Popen(str_command, sp::input{sp::PIPE}, sp::output{sp::PIPE}, sp::error{sp::PIPE});
    if (!str_std_in.empty()) {
        c.send(str_std_in);
    }
    auto [out_res, err_res] = c.communicate();
    stdout_stream.str(std::string{out_res.buf.begin(), out_res.buf.end()});
    stderr_stream.str(std::string{err_res.buf.begin(), err_res.buf.end()});

    std::string result;
    std::string error;
    std::getline(stdout_stream, result);
    std::getline(stderr_stream, error);

    const int n_error = c.retcode();
    if (n_error) throw std::runtime_error(strprintf("RunCommandParseJSON error: process(%s) returned %d: %s\n", str_command, n_error, error));
    if (!result_json.read(result)) throw std::runtime_error("Unable to parse JSON: " + result);

    return result_json;
#else
    throw std::runtime_error("Compiled without external signing support (required for external signing).");
#endif // ENABLE_EXTERNAL_SIGNER
}